

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<Fad<double>_>::Decompose_LDLt(TPZMatrix<Fad<double>_> *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  int i;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  double dVar11;
  ulong uVar12;
  value_type vVar13;
  Fad<double> tmp;
  Fad<double> val;
  Fad<double> sum_1;
  Fad<double> sum;
  Fad<double> local_158;
  Fad<double> local_138;
  Fad<double> local_118;
  ulong local_f8;
  ulong local_f0;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> local_e8;
  undefined1 local_d8 [32];
  Fad<double> local_b8;
  double local_98;
  undefined8 uStack_90;
  Fad<double> local_80;
  undefined1 local_60 [32];
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_40;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  lVar5 = (this->super_TPZBaseMatrix).fRow;
  if (lVar5 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    lVar5 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < (int)(uint)lVar5) {
    local_f8 = (ulong)((uint)lVar5 & 0x7fffffff);
    local_f0 = 1;
    dVar11 = (double)0;
    do {
      local_b8.val_ = 0.0;
      local_b8.dx_.num_elts = 0;
      local_b8.dx_.ptr_to_data = (double *)0x0;
      local_b8.defaultVal = 0.0;
      if (dVar11 != 0.0) {
        uVar12 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_158,this,uVar12,uVar12);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_118,this,uVar12,dVar11);
          local_60._0_8_ = &local_158;
          local_60._8_8_ = &local_118;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_138,this,uVar12,dVar11);
          local_d8._0_8_ = (Fad<double> *)local_60;
          local_d8._8_8_ = &local_138;
          Fad<double>::operator+=
                    (&local_b8,
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                      *)local_d8);
          Fad<double>::~Fad(&local_138);
          Fad<double>::~Fad(&local_118);
          Fad<double>::~Fad(&local_158);
          uVar12 = uVar12 + 1;
        } while (dVar11 != (double)uVar12);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_118,this,dVar11,dVar11);
      iVar4 = local_b8.dx_.num_elts;
      iVar3 = local_118.dx_.num_elts;
      local_158.val_ = local_118.val_ - local_b8.val_;
      uVar2 = local_b8.dx_.num_elts;
      if (local_b8.dx_.num_elts < local_118.dx_.num_elts) {
        uVar2 = local_118.dx_.num_elts;
      }
      local_158.dx_.num_elts = 0;
      local_158.dx_.ptr_to_data = (double *)0x0;
      if (0 < (int)uVar2) {
        local_158.dx_.num_elts = uVar2;
        local_158.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar2 * 8);
        uVar12 = 0;
        pdVar6 = local_118.dx_.ptr_to_data;
        pdVar7 = local_b8.dx_.ptr_to_data;
        do {
          pdVar9 = pdVar6;
          if (iVar3 == 0) {
            pdVar9 = &local_118.defaultVal;
          }
          pdVar10 = pdVar7;
          if (iVar4 == 0) {
            pdVar10 = &local_b8.defaultVal;
          }
          *(double *)((long)local_158.dx_.ptr_to_data + uVar12 * 8) = *pdVar9 - *pdVar10;
          uVar12 = uVar12 + 1;
          pdVar7 = pdVar7 + 1;
          pdVar6 = pdVar6 + 1;
        } while (uVar2 != uVar12);
      }
      local_158.defaultVal = 0.0;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,dVar11,dVar11,&local_158);
      Fad<double>::~Fad(&local_158);
      Fad<double>::~Fad(&local_118);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_158,this,dVar11,dVar11);
      iVar3 = local_158.dx_.num_elts;
      local_80.val_ = local_158.val_;
      local_80.dx_.num_elts = local_158.dx_.num_elts;
      local_80.dx_.ptr_to_data = (double *)0x0;
      if ((long)local_158.dx_.num_elts != 0) {
        uVar12 = (long)local_158.dx_.num_elts * 8;
        if (local_158.dx_.num_elts < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        local_80.dx_.ptr_to_data = (double *)operator_new__(uVar12);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_80.dx_.ptr_to_data,
                   (EVP_PKEY_CTX *)local_158.dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)(uint)iVar3);
      }
      local_98 = ABS(local_80.val_);
      uStack_90 = 0;
      local_80.defaultVal = local_158.defaultVal;
      Fad<double>::~Fad(&local_80);
      if (local_98 < 1e-12) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_98 = (double)((long)dVar11 + 1);
      uVar12 = local_f0;
      if ((ulong)local_98 < local_f8) {
        do {
          local_118.val_ = 0.0;
          local_118.dx_.num_elts = 0;
          local_118.dx_.ptr_to_data = (double *)0x0;
          local_118.defaultVal = 0.0;
          if (dVar11 != 0.0) {
            uVar8 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_138,this,uVar8,uVar8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<double> *)local_d8,this,dVar11,uVar8);
              local_40.fadexpr_.left_ = &local_138;
              local_40.fadexpr_.right_ = (Fad<double> *)local_d8;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<double> *)local_60,this,uVar12,uVar8);
              local_e8.fadexpr_.left_ = &local_40;
              local_e8.fadexpr_.right_ = (Fad<double> *)local_60;
              Fad<double>::operator+=(&local_118,&local_e8);
              Fad<double>::~Fad((Fad<double> *)local_60);
              Fad<double>::~Fad((Fad<double> *)local_d8);
              Fad<double>::~Fad(&local_138);
              uVar8 = uVar8 + 1;
            } while (dVar11 != (double)uVar8);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_d8,this,uVar12,
                     dVar11);
          local_e8.fadexpr_.right_ = &local_118;
          local_60._0_8_ = &local_e8;
          local_138.val_ = ((double)local_d8._0_8_ - local_118.val_) / local_158.val_;
          uVar2 = local_118.dx_.num_elts;
          if (local_118.dx_.num_elts < (int)local_d8._8_4_) {
            uVar2 = local_d8._8_4_;
          }
          if ((int)uVar2 <= local_158.dx_.num_elts) {
            uVar2 = local_158.dx_.num_elts;
          }
          local_138.dx_.num_elts = 0;
          local_138.dx_.ptr_to_data = (double *)0x0;
          local_e8.fadexpr_.left_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_d8;
          if ((int)uVar2 < 1) {
            local_138.defaultVal = 0.0;
            local_60._8_8_ = &local_158;
          }
          else {
            local_138.dx_.num_elts = uVar2;
            local_60._8_8_ = &local_158;
            local_138.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar2 * 8);
            local_138.defaultVal = 0.0;
            uVar8 = 0;
            do {
              vVar13 = FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>
                       ::dx((FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>
                             *)local_60,(int)uVar8);
              local_138.dx_.ptr_to_data[uVar8] = vVar13;
              uVar8 = uVar8 + 1;
            } while (uVar2 != uVar8);
          }
          Fad<double>::~Fad((Fad<double> *)local_d8);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar12,dVar11,&local_138);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,dVar11,uVar12,&local_138);
          Fad<double>::~Fad(&local_138);
          Fad<double>::~Fad(&local_118);
          uVar12 = uVar12 + 1;
        } while (uVar12 != local_f8);
      }
      Fad<double>::~Fad(&local_158);
      Fad<double>::~Fad(&local_b8);
      local_f0 = local_f0 + 1;
      dVar11 = local_98;
    } while (local_98 != (double)local_f8);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}